

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_hasOwnProperty(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue JVar1;
  JSAtom JVar2;
  int iVar3;
  int64_t in_R8;
  JSValue JVar4;
  JSContext *unaff_retaddr;
  JSValue in_stack_00000008;
  BOOL ret;
  JSObject *p;
  JSAtom atom;
  JSValue obj;
  JSAtom in_stack_000000c4;
  JSObject *in_stack_000000c8;
  JSPropertyDescriptor *in_stack_000000d0;
  JSContext *in_stack_000000d8;
  JSAtom in_stack_ffffffffffffff6c;
  JSValueUnion ctx_00;
  int64_t iVar5;
  undefined4 in_stack_ffffffffffffff80;
  JSContext *in_stack_ffffffffffffff98;
  JSValueUnion JVar6;
  JSValueUnion in_stack_ffffffffffffffa0;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  JVar4.tag = in_R8;
  JVar4.u.float64 = in_stack_ffffffffffffffa0.float64;
  JVar2 = JS_ValueToAtom(in_stack_ffffffffffffff98,JVar4);
  if (JVar2 == 0) {
    local_30 = 0;
    local_28 = 6;
  }
  else {
    JVar4 = JS_ToObject(unaff_retaddr,in_stack_00000008);
    ctx_00 = JVar4.u;
    iVar5 = JVar4.tag;
    JVar6 = ctx_00;
    local_28 = iVar5;
    iVar3 = JS_IsException(JVar4);
    if (iVar3 == 0) {
      iVar3 = JS_GetOwnPropertyInternal
                        (in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c4);
      JS_FreeAtom((JSContext *)ctx_00.ptr,in_stack_ffffffffffffff6c);
      v.tag._0_4_ = in_stack_ffffffffffffff80;
      v.u = (JSValueUnion)iVar5;
      v.tag._4_4_ = iVar3;
      JS_FreeValue((JSContext *)ctx_00.ptr,v);
      if (iVar3 < 0) {
        local_30 = 0;
        local_28 = 6;
      }
      else {
        local_30 = (uint)(iVar3 != 0);
        uStack_2c = uStack_c;
        local_28 = 1;
      }
    }
    else {
      JS_FreeAtom((JSContext *)ctx_00.ptr,in_stack_ffffffffffffff6c);
      local_30 = JVar6.int32;
      uStack_2c = JVar6._4_4_;
    }
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_object_hasOwnProperty(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv)
{
    JSValue obj;
    JSAtom atom;
    JSObject *p;
    BOOL ret;

    atom = JS_ValueToAtom(ctx, argv[0]); /* must be done first */
    if (unlikely(atom == JS_ATOM_NULL))
        return JS_EXCEPTION;
    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj)) {
        JS_FreeAtom(ctx, atom);
        return obj;
    }
    p = JS_VALUE_GET_OBJ(obj);
    ret = JS_GetOwnPropertyInternal(ctx, NULL, p, atom);
    JS_FreeAtom(ctx, atom);
    JS_FreeValue(ctx, obj);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}